

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  bool *v1;
  bool *v2;
  char *pcVar1;
  LogMessage *pLVar2;
  anon_enum_32 *v2_00;
  LogMessage local_60;
  Voidify local_49;
  anon_enum_32 local_48;
  int local_44;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_22;
  bool local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int size_local;
  bool is_soo_local;
  SooRep *this_local;
  
  absl_log_internal_check_op_result._0_4_ = size;
  absl_log_internal_check_op_result._7_1_ = is_soo;
  _size_local = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                 ((bool *)((long)&absl_log_internal_check_op_result + 7));
  local_21 = SooRep::is_soo(this);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_21);
  local_20 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                       (v1,v2,"is_soo == this->is_soo()");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0xd1,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_22,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) == 0) {
    (this->field_0).long_rep.size = (int)absl_log_internal_check_op_result;
  }
  else {
    local_44 = absl::lts_20250127::log_internal::GetReferenceableValue
                         ((int)absl_log_internal_check_op_result);
    local_48 = kSooSizeMask;
    v2_00 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::internal::__0>
                      (&local_48);
    local_40 = absl::lts_20250127::log_internal::Check_LEImpl<int,google::protobuf::internal::__0>
                         (&local_44,v2_00,"size <= kSooSizeMask");
    if (local_40 != (Nullable<const_char_*>)0x0) {
      pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0xd3,pcVar1);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    (this->field_0).long_rep.elements_int =
         (this->field_0).long_rep.elements_int & 0xfffffffffffffff8;
    (this->field_0).long_rep.elements_int =
         (long)(int)absl_log_internal_check_op_result | (this->field_0).long_rep.elements_int;
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }